

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O0

int accept_pathname(char *pathname)

{
  int iVar1;
  char *pathname_local;
  
  if ((include.stqh_first != (pattern *)0x0) &&
     (iVar1 = match_pattern(&include,pathname), iVar1 == 0)) {
    return 0;
  }
  if ((exclude.stqh_first != (pattern *)0x0) &&
     (iVar1 = match_pattern(&exclude,pathname), iVar1 != 0)) {
    return 0;
  }
  return 1;
}

Assistant:

static int
accept_pathname(const char *pathname)
{

	if (!STAILQ_EMPTY(&include) && !match_pattern(&include, pathname))
		return (0);
	if (!STAILQ_EMPTY(&exclude) && match_pattern(&exclude, pathname))
		return (0);
	return (1);
}